

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

uint32_t nsync_spin_test_and_set_(nsync_atomic_uint32_ *w,uint32_t test,uint32_t set,uint32_t clear)

{
  uint uVar1;
  uint uVar2;
  uint attempts;
  
  attempts = 0;
  do {
    uVar2 = *w;
    if ((uVar2 & test) == 0) {
      LOCK();
      uVar1 = *w;
      if (uVar2 == uVar1) {
        *w = (uVar2 | set) & ~clear;
      }
      UNLOCK();
      if (uVar2 == uVar1) {
        return uVar2;
      }
    }
    attempts = nsync_spin_delay_(attempts);
  } while( true );
}

Assistant:

uint32_t nsync_spin_test_and_set_ (nsync_atomic_uint32_ *w, uint32_t test,
				   uint32_t set, uint32_t clear) {
	unsigned attempts = 0; /* CV_SPINLOCK retry count */
	uint32_t old = ATM_LOAD (w);
	while ((old & test) != 0 || !ATM_CAS_ACQ (w, old, (old | set) & ~clear)) {
		attempts = nsync_spin_delay_ (attempts);
		old = ATM_LOAD (w);
	}
	return (old);
}